

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

bool __thiscall idx2::linear_allocator::Alloc(linear_allocator *this,buffer *Buf,i64 Bytes)

{
  long lVar1;
  long lVar2;
  
  lVar2 = (this->Block).Bytes;
  lVar1 = this->CurrentBytes + Bytes;
  if (lVar1 <= lVar2) {
    Buf->Data = (this->Block).Data + this->CurrentBytes;
    Buf->Bytes = Bytes;
    Buf->Alloc = (allocator *)this;
    this->CurrentBytes = lVar1;
  }
  return lVar1 <= lVar2;
}

Assistant:

bool
linear_allocator::Alloc(buffer* Buf, i64 Bytes)
{
  if (CurrentBytes + Bytes <= Block.Bytes)
  {
    Buf->Data = Block.Data + CurrentBytes;
    Buf->Bytes = Bytes;
    Buf->Alloc = this;
    CurrentBytes += Bytes;
    return true;
  }
  return false;
}